

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QItemSelectionRange *range)

{
  quintptr *pqVar1;
  QPersistentModelIndexData *pQVar2;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QPersistentModelIndex local_68;
  QDebug local_60;
  QPersistentModelIndex local_58;
  QDebug local_50;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)range);
  pQVar2 = (range->tl).d;
  *(undefined1 *)&pQVar2[1].index.m.ptr = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QItemSelectionRange(";
  QString::fromUtf8(&local_40,(QString *)0x14,ba);
  QTextStream::operator<<((QTextStream *)pQVar2,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (range->tl).d;
  if (*(char *)&pQVar2[1].index.m.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  local_68.d = (range->tl).d;
  pqVar1 = &local_68.d[1].index.i;
  *(int *)pqVar1 = (int)*pqVar1 + 1;
  operator<<((Stream *)&local_60,&local_68);
  QTextStream::operator<<(&(local_60.stream)->ts,',');
  if ((local_60.stream)->space == true) {
    QTextStream::operator<<(&(local_60.stream)->ts,' ');
  }
  local_58.d = (QPersistentModelIndexData *)local_60.stream;
  (local_60.stream)->ref = (local_60.stream)->ref + 1;
  operator<<((Stream *)&local_50,&local_58);
  QTextStream::operator<<(&(local_50.stream)->ts,')');
  if ((local_50.stream)->space == true) {
    QTextStream::operator<<(&(local_50.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_50);
  QDebug::~QDebug((QDebug *)&local_58);
  QDebug::~QDebug(&local_60);
  QDebug::~QDebug((QDebug *)&local_68);
  pQVar2 = (range->tl).d;
  (range->tl).d = (QPersistentModelIndexData *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QItemSelectionRange &range)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QItemSelectionRange(" << range.topLeft()
                  << ',' << range.bottomRight() << ')';
    return dbg;
}